

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O2

string_view google::protobuf::internal::FindName(char *name_data,size_t entries,size_t index)

{
  size_t sVar1;
  ulong uVar2;
  string_view sVar3;
  
  uVar2 = entries + 7 & 0xfffffffffffffff8;
  for (sVar1 = 0; index != sVar1; sVar1 = sVar1 + 1) {
    uVar2 = uVar2 + (byte)name_data[sVar1];
  }
  sVar3._M_len = (size_t)name_data[index];
  sVar3._M_str = name_data + uVar2;
  return sVar3;
}

Assistant:

static absl::string_view FindName(const char* name_data, size_t entries,
                                  size_t index) {
  // The compiler unrolls these... if this isn't fast enough,
  // there's an AVX version at https://godbolt.org/z/eojrjqzfr
  // ARM-compatible version at https://godbolt.org/z/n5YT5Ee85

  // The field name sizes are padded up to a multiple of 8, so we
  // must pad them here.
  size_t num_sizes = (entries + 7) & -8;
  auto* uint8s = reinterpret_cast<const uint8_t*>(name_data);
  size_t pos = std::accumulate(uint8s, uint8s + index, num_sizes);
  size_t size = name_data[index];
  auto* start = &name_data[pos];
  return {start, size};
}